

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deFilePath.cpp
# Opt level: O0

Type __thiscall de::FilePath::getType(FilePath *this)

{
  int iVar1;
  char *__file;
  int type;
  undefined1 local_c8 [4];
  int result;
  stat st;
  FilePath normPath;
  FilePath *this_local;
  
  normalize((FilePath *)(st.__glibc_reserved + 2),this);
  __file = getPath((FilePath *)(st.__glibc_reserved + 2));
  iVar1 = stat(__file,(stat *)local_c8);
  if (iVar1 == 0) {
    if (((uint)st.st_nlink & 0xf000) == 0x8000) {
      this_local._4_4_ = TYPE_FILE;
    }
    else if (((uint)st.st_nlink & 0xf000) == 0x4000) {
      this_local._4_4_ = TYPE_DIRECTORY;
    }
    else {
      this_local._4_4_ = TYPE_UNKNOWN;
    }
  }
  else {
    this_local._4_4_ = TYPE_UNKNOWN;
  }
  ~FilePath((FilePath *)(st.__glibc_reserved + 2));
  return this_local._4_4_;
}

Assistant:

FilePath::Type FilePath::getType (void) const
{
	FilePath	normPath	= FilePath::normalize(*this);
	struct		stat		st;
	int			result		= stat(normPath.getPath(), &st);

	if (result != 0)
		return TYPE_UNKNOWN;

	int type = st.st_mode & S_IFMT;
	if (type == S_IFREG)
		return TYPE_FILE;
	else if (type == S_IFDIR)
		return TYPE_DIRECTORY;
	else
		return TYPE_UNKNOWN;
}